

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

NodeSet * __thiscall
capnp::compiler::NodeTranslator::getBootstrapNode
          (NodeSet *__return_storage_ptr__,NodeTranslator *this)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  AuxNode *pAVar4;
  anon_class_1_0_00000001 local_161;
  Mapper<kj::Vector<capnp::compiler::NodeTranslator::AuxNode>_&> local_160;
  undefined4 local_158;
  anon_class_1_0_00000001 local_151;
  Mapper<kj::Vector<capnp::compiler::NodeTranslator::AuxNode>_&> local_150;
  undefined1 auStack_148 [8];
  ReaderFor<capnp::schema::Node> nodeReader;
  AuxNode *paramStruct;
  AuxNode *__end2_1;
  AuxNode *__begin2_1;
  Vector<capnp::compiler::NodeTranslator::AuxNode> *__range2_1;
  AuxNode *local_98;
  AuxNode *group;
  AuxNode *__end2;
  AuxNode *__begin2;
  Vector<capnp::compiler::NodeTranslator::AuxNode> *__range2;
  ReaderFor<capnp::schema::Node::SourceInfo> local_68;
  undefined1 local_38 [8];
  ArrayBuilder<capnp::schema::Node::SourceInfo::Reader> sourceInfos;
  NodeTranslator *this_local;
  
  sourceInfos.disposer = (ArrayDisposer *)this;
  sVar2 = kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::size(&this->groups);
  sVar3 = kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::size(&this->paramStructs);
  kj::heapArrayBuilder<capnp::schema::Node::SourceInfo::Reader>
            ((ArrayBuilder<capnp::schema::Node::SourceInfo::Reader> *)local_38,sVar2 + 1 + sVar3);
  Orphan<capnp::schema::Node::SourceInfo>::getReader(&local_68,&this->sourceInfo);
  kj::ArrayBuilder<capnp::schema::Node::SourceInfo::Reader>::
  add<capnp::schema::Node::SourceInfo::Reader>
            ((ArrayBuilder<capnp::schema::Node::SourceInfo::Reader> *)local_38,&local_68);
  __begin2 = (AuxNode *)&this->groups;
  __end2 = kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::begin
                     ((Vector<capnp::compiler::NodeTranslator::AuxNode> *)__begin2);
  group = kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::end
                    ((Vector<capnp::compiler::NodeTranslator::AuxNode> *)__begin2);
  for (; __end2 != group; __end2 = __end2 + 1) {
    local_98 = __end2;
    Orphan<capnp::schema::Node::SourceInfo>::getReader
              ((ReaderFor<capnp::schema::Node::SourceInfo> *)&__range2_1,&__end2->sourceInfo);
    kj::ArrayBuilder<capnp::schema::Node::SourceInfo::Reader>::
    add<capnp::schema::Node::SourceInfo::Reader>
              ((ArrayBuilder<capnp::schema::Node::SourceInfo::Reader> *)local_38,
               (Reader *)&__range2_1);
  }
  __end2_1 = kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::begin(&this->paramStructs);
  pAVar4 = kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::end(&this->paramStructs);
  for (; __end2_1 != pAVar4; __end2_1 = __end2_1 + 1) {
    Orphan<capnp::schema::Node::SourceInfo>::getReader
              ((ReaderFor<capnp::schema::Node::SourceInfo> *)&nodeReader._reader.nestingLimit,
               &__end2_1->sourceInfo);
    kj::ArrayBuilder<capnp::schema::Node::SourceInfo::Reader>::
    add<capnp::schema::Node::SourceInfo::Reader>
              ((ArrayBuilder<capnp::schema::Node::SourceInfo::Reader> *)local_38,
               (Reader *)&nodeReader._reader.nestingLimit);
  }
  Orphan<capnp::schema::Node>::getReader
            ((ReaderFor<capnp::schema::Node> *)auStack_148,&this->wipNode);
  bVar1 = capnp::schema::Node::Reader::isInterface((Reader *)auStack_148);
  if (bVar1) {
    *(WirePointer **)&(__return_storage_ptr__->node)._reader.dataSize = nodeReader._reader.pointers;
    (__return_storage_ptr__->node)._reader.nestingLimit = nodeReader._reader.dataSize;
    *(StructPointerCount *)&(__return_storage_ptr__->node)._reader.field_0x2c =
         nodeReader._reader.pointerCount;
    *(undefined2 *)&(__return_storage_ptr__->node)._reader.field_0x2e = nodeReader._reader._38_2_;
    (__return_storage_ptr__->node)._reader.data = nodeReader._reader.capTable;
    (__return_storage_ptr__->node)._reader.pointers = (WirePointer *)nodeReader._reader.data;
    (__return_storage_ptr__->node)._reader.segment = (SegmentReader *)auStack_148;
    (__return_storage_ptr__->node)._reader.capTable = (CapTableReader *)nodeReader._reader.segment;
    kj::_::Mapper<kj::Vector<capnp::compiler::NodeTranslator::AuxNode>_&>::Mapper
              (&local_150,&this->paramStructs);
    kj::_::Mapper<kj::Vector<capnp::compiler::NodeTranslator::AuxNode>_&>::
    operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_node_translator_c__:613:7)>
              (&__return_storage_ptr__->auxNodes,&local_150,&local_151);
    kj::ArrayBuilder<capnp::schema::Node::SourceInfo::Reader>::finish
              (&__return_storage_ptr__->sourceInfo,
               (ArrayBuilder<capnp::schema::Node::SourceInfo::Reader> *)local_38);
  }
  else {
    *(WirePointer **)&(__return_storage_ptr__->node)._reader.dataSize = nodeReader._reader.pointers;
    (__return_storage_ptr__->node)._reader.nestingLimit = nodeReader._reader.dataSize;
    *(StructPointerCount *)&(__return_storage_ptr__->node)._reader.field_0x2c =
         nodeReader._reader.pointerCount;
    *(undefined2 *)&(__return_storage_ptr__->node)._reader.field_0x2e = nodeReader._reader._38_2_;
    (__return_storage_ptr__->node)._reader.data = nodeReader._reader.capTable;
    (__return_storage_ptr__->node)._reader.pointers = (WirePointer *)nodeReader._reader.data;
    (__return_storage_ptr__->node)._reader.segment = (SegmentReader *)auStack_148;
    (__return_storage_ptr__->node)._reader.capTable = (CapTableReader *)nodeReader._reader.segment;
    kj::_::Mapper<kj::Vector<capnp::compiler::NodeTranslator::AuxNode>_&>::Mapper
              (&local_160,&this->groups);
    kj::_::Mapper<kj::Vector<capnp::compiler::NodeTranslator::AuxNode>_&>::
    operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_node_translator_c__:619:7)>
              (&__return_storage_ptr__->auxNodes,&local_160,&local_161);
    kj::ArrayBuilder<capnp::schema::Node::SourceInfo::Reader>::finish
              (&__return_storage_ptr__->sourceInfo,
               (ArrayBuilder<capnp::schema::Node::SourceInfo::Reader> *)local_38);
  }
  local_158 = 1;
  kj::ArrayBuilder<capnp::schema::Node::SourceInfo::Reader>::~ArrayBuilder
            ((ArrayBuilder<capnp::schema::Node::SourceInfo::Reader> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

NodeTranslator::NodeSet NodeTranslator::getBootstrapNode() {
  auto sourceInfos = kj::heapArrayBuilder<schema::Node::SourceInfo::Reader>(
      1 + groups.size() + paramStructs.size());
  sourceInfos.add(sourceInfo.getReader());
  for (auto& group: groups) {
    sourceInfos.add(group.sourceInfo.getReader());
  }
  for (auto& paramStruct: paramStructs) {
    sourceInfos.add(paramStruct.sourceInfo.getReader());
  }

  auto nodeReader = wipNode.getReader();
  if (nodeReader.isInterface()) {
    return NodeSet {
      nodeReader,
      KJ_MAP(g, paramStructs) { return g.node.getReader(); },
      sourceInfos.finish()
    };
  } else {
    return NodeSet {
      nodeReader,
      KJ_MAP(g, groups) { return g.node.getReader(); },
      sourceInfos.finish()
    };
  }
}